

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

void snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  ulong __maxlen;
  size_t sVar8;
  int iVar9;
  char *pcVar10;
  int *piVar11;
  uint uVar12;
  long lVar13;
  
  uVar1 = cf->can_id;
  if ((uVar1 >> 0x1d & 1) != 0) {
    if (0x200 < (uVar1 & 0x1fffffff)) {
      fprintf(_stderr,"Error class %#x is invalid\n");
      return;
    }
    pcVar5 = ",";
    if (sep != (char *)0x0) {
      pcVar5 = sep;
    }
    piVar11 = &error_classes_rel;
    iVar9 = 0;
    iVar7 = 0;
    for (lVar13 = 0; lVar6 = (long)iVar9, lVar13 != 9; lVar13 = lVar13 + 1) {
      uVar12 = (uint)lVar13;
      if ((uVar1 >> (uVar12 & 0x1f) & 1) != 0) {
        if (iVar7 != 0) {
          uVar2 = snprintf(buf + lVar6,len - lVar6,"%s",pcVar5);
          if ((int)uVar2 < 0) {
            return;
          }
          if (len - lVar6 <= (ulong)uVar2) {
            return;
          }
          iVar9 = iVar9 + uVar2;
        }
        __maxlen = len - (long)iVar9;
        uVar2 = snprintf(buf + iVar9,__maxlen,"%s",(long)&error_classes_rel + (long)*piVar11);
        if ((int)uVar2 < 0) {
          return;
        }
        if (__maxlen <= uVar2) {
          return;
        }
        iVar9 = uVar2 + iVar9;
        lVar6 = (long)iVar9;
        if (uVar12 == 3) {
          iVar3 = 0;
          sVar8 = len - lVar6;
          if (sVar8 != 0) {
            pcVar10 = buf + lVar6;
            iVar3 = snprintf(pcVar10,sVar8,"{{");
            iVar4 = snprintf_error_data(pcVar10 + iVar3,sVar8 - (long)iVar3,cf->data[2],
                                        protocol_violation_types,8);
            iVar3 = iVar3 + iVar4;
            iVar4 = snprintf(pcVar10 + iVar3,sVar8 - (long)iVar3,"}{");
            iVar3 = iVar3 + iVar4;
            if ((byte)(cf->data[3] - 1) < 0x1f) {
              iVar4 = snprintf(pcVar10 + iVar3,sVar8 - (long)iVar3,"%s",
                               protocol_violation_locations_rel +
                               *(int *)(protocol_violation_locations_rel + (ulong)cf->data[3] * 4));
              iVar3 = iVar3 + iVar4;
            }
            iVar4 = snprintf(pcVar10 + iVar3,sVar8 - (long)iVar3,"}}");
            iVar3 = iVar3 + iVar4;
          }
LAB_00103d03:
          iVar9 = iVar9 + iVar3;
        }
        else {
          if (uVar12 == 2) {
            iVar3 = 0;
            sVar8 = len - lVar6;
            if (sVar8 != 0) {
              pcVar10 = buf + lVar6;
              iVar3 = snprintf(pcVar10,sVar8,"{");
              iVar4 = snprintf_error_data(pcVar10 + iVar3,sVar8 - (long)iVar3,cf->data[1],
                                          controller_problems,7);
              iVar3 = iVar3 + iVar4;
              iVar4 = snprintf(pcVar10 + iVar3,sVar8 - (long)iVar3,"}");
              iVar3 = iVar3 + iVar4;
            }
            goto LAB_00103d03;
          }
          if (uVar12 == 1) {
            iVar3 = 0;
            if (len - lVar6 != 0) {
              iVar3 = snprintf(buf + lVar6,len - lVar6,"{at bit %d}",(ulong)cf->data[0]);
            }
            iVar9 = iVar9 + iVar3;
          }
        }
        iVar7 = iVar7 + 1;
      }
      piVar11 = piVar11 + 1;
    }
    if ((((cf->can_id & 0x200) != 0) || (cf->data[6] != '\0')) || (cf->data[7] != '\0')) {
      iVar7 = snprintf(buf + lVar6,len - lVar6,"%s",pcVar5);
      snprintf(buf + (iVar7 + iVar9),len - (long)(iVar7 + iVar9),"error-counter-tx-rx{{%d}{%d}}",
               (ulong)cf->data[6],(ulong)cf->data[7]);
      return;
    }
  }
  return;
}

Assistant:

void snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes){
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n){
					return;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n){
				return;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			classes++;
		}
	}

	if (cf->can_id & CAN_ERR_CNT || cf->data[6] || cf->data[7]) {
		n += snprintf(buf + n, len - n, "%s", sep);
		n += snprintf(buf + n, len - n, "error-counter-tx-rx{{%d}{%d}}",
			      cf->data[6], cf->data[7]);
	}
}